

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

int __thiscall
chrono::ChBezierCurveTracker::calcClosestPoint
          (ChBezierCurveTracker *this,ChVector<double> *loc,ChFrame<double> *tnb,double *curvature)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  ChVector<double> r;
  ChVector<double> rpp;
  ChVector<double> rp;
  ChVector<double> local_b8;
  ChVector<double> local_a0;
  ChVector<double> local_88;
  undefined1 local_70 [48];
  double local_40;
  double local_38;
  double local_30;
  
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  iVar1 = calcClosestPoint(this,loc,&local_b8);
  ChBezierCurve::evalD
            (&local_88,*(ChBezierCurve **)this,*(size_t *)(this + 0x10),*(double *)(this + 0x18));
  ChBezierCurve::evalDD
            (&local_a0,*(ChBezierCurve **)this,*(size_t *)(this + 0x10),*(double *)(this + 0x18));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_88.m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_a0.m_data[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_88.m_data[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_a0.m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_88.m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_a0.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_88.m_data[2] * local_a0.m_data[1];
  auVar12 = vfmsub231sd_fma(auVar12,auVar17,auVar3);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_a0.m_data[2] * local_88.m_data[0];
  auVar7 = vfmsub231sd_fma(auVar15,auVar24,auVar7);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_a0.m_data[0] * local_88.m_data[1];
  auVar10 = vfmsub231sd_fma(auVar19,auVar21,auVar10);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_88.m_data[1] * local_88.m_data[1];
  auVar2 = vfmadd231sd_fma(auVar4,auVar21,auVar21);
  auVar2 = vfmadd231sd_fma(auVar2,auVar24,auVar24);
  auVar2 = vsqrtsd_avx(auVar2,auVar2);
  dVar14 = auVar7._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar14 * dVar14;
  auVar3 = vfmadd231sd_fma(auVar5,auVar12,auVar12);
  auVar3 = vfmadd231sd_fma(auVar3,auVar10,auVar10);
  auVar3 = vsqrtsd_avx(auVar3,auVar3);
  dVar28 = auVar2._0_8_;
  local_40 = 1.0 / dVar28;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar2 = vandpd_avx512vl(auVar3,auVar2);
  local_70._0_8_ = local_88.m_data[0] * local_40;
  local_70._24_8_ = local_88.m_data[1] * local_40;
  local_40 = local_88.m_data[2] * local_40;
  if (auVar2._0_8_ <= 1e-06) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_40;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_70._24_8_;
    auVar12 = vfmsub213sd_fma(ZEXT816(0),auVar6,auVar8);
    local_70._8_8_ = auVar12._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (double)local_70._0_8_ * -0.0;
    auVar2 = vfmadd231sd_fma(auVar23,auVar8,ZEXT816(0) << 0x40);
    local_38 = auVar2._0_8_;
    dVar14 = (double)local_70._0_8_ + local_40 * -0.0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_70._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)local_70._8_8_ * (double)local_70._24_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar14;
    auVar7 = vfmsub231sd_fma(auVar16,auVar11,auVar20);
    local_30 = auVar7._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_70._24_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar14 * local_40;
    auVar2 = vfmsub231sd_fma(auVar13,auVar9,auVar2);
    local_70._16_8_ = auVar2._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_38 * (double)local_70._0_8_;
    auVar2 = vfmsub231sd_fma(auVar26,auVar6,auVar12);
    local_70._32_16_ = vunpcklpd_avx(auVar20,auVar2);
  }
  else {
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_88.m_data[1] * auVar10._0_8_;
    auVar5 = vfmsub231sd_fma(auVar27,auVar7,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_88.m_data[2] * auVar12._0_8_;
    auVar2 = vfmsub231sd_fma(auVar25,auVar10,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_88.m_data[0] * dVar14;
    auVar15 = vfmsub231sd_fma(auVar22,auVar12,auVar17);
    auVar29._8_8_ = 0x3ff0000000000000;
    auVar29._0_8_ = 0x3ff0000000000000;
    auVar4 = vunpcklpd_avx(auVar2,auVar7);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar28 * auVar3._0_8_;
    auVar2 = vunpcklpd_avx(auVar18,auVar3);
    auVar2 = vdivpd_avx(auVar29,auVar2);
    local_38 = auVar2._0_8_;
    local_70._8_8_ = auVar5._0_8_ * local_38;
    auVar7 = vshufpd_avx(auVar2,auVar2,1);
    local_70._32_8_ = local_38 * auVar4._0_8_;
    local_70._40_8_ = auVar2._8_8_ * auVar4._8_8_;
    local_38 = local_38 * auVar15._0_8_;
    local_70._16_8_ = auVar7._0_8_ * auVar12._0_8_;
    local_30 = auVar7._0_8_ * auVar10._0_8_;
  }
  ChFrame<double>::SetRot(tnb,(ChMatrix33<double> *)local_70);
  (tnb->coord).pos.m_data[0] = local_b8.m_data[0];
  (tnb->coord).pos.m_data[1] = local_b8.m_data[1];
  (tnb->coord).pos.m_data[2] = local_b8.m_data[2];
  *curvature = auVar3._0_8_ / (dVar28 * dVar28 * dVar28);
  return iVar1;
}

Assistant:

int ChBezierCurveTracker::calcClosestPoint(const ChVector<>& loc, ChFrame<>& tnb, double& curvature) {
    // Find closest point to specified location
    ChVector<> r;
    int flag = calcClosestPoint(loc, r);

    // Find 1st and 2nd order derivative vectors at the closest point
    ChVector<> rp = m_path->evalD(m_curInterval, m_curParam);
    ChVector<> rpp = m_path->evalDD(m_curInterval, m_curParam);

    // Calculate TNB frame
    ChVector<> rp_rpp = Vcross(rp, rpp);
    double rp_norm = rp.Length();
    double rp_rpp_norm = rp_rpp.Length();

    ChVector<> T = rp / rp_norm;
    ChVector<> N;
    ChVector<> B;
    if (std::abs(rp_rpp_norm) > 1e-6) {
        N = Vcross(rp_rpp, rp) / (rp_norm * rp_rpp_norm);
        B = rp_rpp / rp_rpp_norm;
    } else {  // Zero curvature
        B = ChVector<>(0, 0, 1);
        N = Vcross(B, T);
        B = Vcross(T, N);
    }

    ChMatrix33<> A(T, N, B);

    tnb.SetRot(A);
    tnb.SetPos(r);


    // Calculate curvature
    curvature = rp_rpp_norm / (rp_norm * rp_norm * rp_norm);

    return flag;
}